

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O2

mz_ulong mz_adler32(mz_ulong adler,uchar *ptr,size_t buf_len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  mz_ulong mVar12;
  long lVar13;
  
  if (ptr == (uchar *)0x0) {
    mVar12 = 1;
  }
  else {
    uVar11 = adler >> 0x10;
    uVar10 = adler & 0xffff;
    uVar7 = buf_len % 0x15b0;
    while (buf_len != 0) {
      for (lVar13 = 0; (int)lVar13 + 7U < (uint)uVar7; lVar13 = lVar13 + 8) {
        iVar8 = (int)uVar10 + (uint)ptr[lVar13];
        iVar1 = (uint)ptr[lVar13 + 1] + iVar8;
        iVar4 = (uint)ptr[lVar13 + 2] + iVar1;
        iVar2 = (uint)ptr[lVar13 + 3] + iVar4;
        iVar5 = (uint)ptr[lVar13 + 4] + iVar2;
        iVar3 = (uint)ptr[lVar13 + 5] + iVar5;
        iVar6 = (uint)ptr[lVar13 + 6] + iVar3;
        uVar9 = (uint)ptr[lVar13 + 7] + iVar6;
        uVar10 = (ulong)uVar9;
        uVar11 = (ulong)((int)uVar11 + iVar8 + iVar1 + iVar4 + iVar2 + iVar5 + iVar3 + iVar6 + uVar9
                        );
      }
      while( true ) {
        if ((uint)uVar7 <= (uint)lVar13) break;
        uVar9 = (int)uVar10 + (uint)ptr[lVar13];
        uVar10 = (ulong)uVar9;
        uVar11 = (ulong)((int)uVar11 + uVar9);
        lVar13 = lVar13 + 1;
      }
      uVar10 = uVar10 % 0xfff1;
      uVar11 = (uVar11 & 0xffffffff) % 0xfff1;
      ptr = ptr + lVar13;
      buf_len = buf_len - uVar7;
      uVar7 = 0x15b0;
    }
    mVar12 = (mz_ulong)((int)uVar11 << 0x10 | (uint)uVar10);
  }
  return mVar12;
}

Assistant:

mz_ulong mz_adler32(mz_ulong adler, const unsigned char *ptr, size_t buf_len)
{
  mz_uint32 i, s1 = (mz_uint32)(adler & 0xffff), s2 = (mz_uint32)(adler >> 16); size_t block_len = buf_len % 5552;
  if (!ptr) return MZ_ADLER32_INIT;
  while (buf_len) {
    for (i = 0; i + 7 < block_len; i += 8, ptr += 8) {
      s1 += ptr[0], s2 += s1; s1 += ptr[1], s2 += s1; s1 += ptr[2], s2 += s1; s1 += ptr[3], s2 += s1;
      s1 += ptr[4], s2 += s1; s1 += ptr[5], s2 += s1; s1 += ptr[6], s2 += s1; s1 += ptr[7], s2 += s1;
    }
    for ( ; i < block_len; ++i) s1 += *ptr++, s2 += s1;
    s1 %= 65521U, s2 %= 65521U; buf_len -= block_len; block_len = 5552;
  }
  return (s2 << 16) + s1;
}